

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap.cpp
# Opt level: O0

void Assimp::Bitmap::WriteDIB(DIB *dib,IOStream *file)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  size_t offset;
  uint8_t data [40];
  IOStream *file_local;
  DIB *dib_local;
  
  sVar1 = Copy<unsigned_int>((uint8_t *)&offset,&dib->size);
  sVar2 = Copy<int>(data + (sVar1 - 8),&dib->width);
  sVar3 = Copy<int>(data + sVar2 + sVar1 + -8,&dib->height);
  lVar4 = sVar3 + sVar2 + sVar1;
  sVar1 = Copy<unsigned_short>(data + lVar4 + -8,&dib->planes);
  lVar4 = sVar1 + lVar4;
  sVar1 = Copy<unsigned_short>(data + lVar4 + -8,&dib->bits_per_pixel);
  lVar4 = sVar1 + lVar4;
  sVar1 = Copy<unsigned_int>(data + lVar4 + -8,&dib->compression);
  lVar4 = sVar1 + lVar4;
  sVar1 = Copy<unsigned_int>(data + lVar4 + -8,&dib->image_size);
  lVar4 = sVar1 + lVar4;
  sVar1 = Copy<int>(data + lVar4 + -8,&dib->x_resolution);
  lVar4 = sVar1 + lVar4;
  sVar1 = Copy<int>(data + lVar4 + -8,&dib->y_resolution);
  lVar4 = sVar1 + lVar4;
  sVar1 = Copy<unsigned_int>(data + lVar4 + -8,&dib->nb_colors);
  Copy<unsigned_int>(data + sVar1 + lVar4 + -8,&dib->nb_important_colors);
  (*file->_vptr_IOStream[3])(file,&offset,0x28,1);
  return;
}

Assistant:

void Bitmap::WriteDIB(DIB& dib, IOStream* file) {
        uint8_t data[DIB::dib_size];

        std::size_t offset = 0;

        offset += Copy(&data[offset], dib.size);
        offset += Copy(&data[offset], dib.width);
        offset += Copy(&data[offset], dib.height);
        offset += Copy(&data[offset], dib.planes);
        offset += Copy(&data[offset], dib.bits_per_pixel);
        offset += Copy(&data[offset], dib.compression);
        offset += Copy(&data[offset], dib.image_size);
        offset += Copy(&data[offset], dib.x_resolution);
        offset += Copy(&data[offset], dib.y_resolution);
        offset += Copy(&data[offset], dib.nb_colors);
                  Copy(&data[offset], dib.nb_important_colors);

        file->Write(data, DIB::dib_size, 1);
    }